

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O3

void __thiscall wasm::FunctionValidator::visitTry(FunctionValidator *this,Try *curr)

{
  Name *pNVar1;
  Type right;
  Type left;
  size_t sVar2;
  Expression *pEVar3;
  Function *func;
  Tag *pTVar4;
  ostringstream *poVar5;
  ostream *poVar6;
  long lVar7;
  ostream *poVar8;
  Pop *pPVar9;
  char *pcVar10;
  pointer ppPVar11;
  char *pcVar12;
  ulong uVar13;
  Try *curr_00;
  uint uVar14;
  Pop *pPVar15;
  bool bVar16;
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  Name name_04;
  Name name_05;
  Name name_06;
  undefined1 local_70 [8];
  SmallVector<wasm::Pop_*,_1UL> pops;
  
  ValidationInfo::shouldBeTrue<wasm::Try*>
            (this->info,
             SUB41(((((this->
                      super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                      ).
                      super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .
                      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .currModule)->features).features & 0x40) >> 6,0),curr,
             "try requires exception-handling [--enable-exception-handling]",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  pNVar1 = &curr->name;
  pcVar12 = (curr->name).super_IString.str._M_str;
  if (pcVar12 != (char *)0x0) {
    name_04.super_IString.str._M_str = pcVar12;
    name_04.super_IString.str._M_len = (pNVar1->super_IString).str._M_len;
    noteLabelName(this,name_04);
  }
  right.id = (curr->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.type.id;
  left.id = (curr->body->type).id;
  if (right.id == 1) {
    ValidationInfo::shouldBeEqual<wasm::Try*,wasm::Type>
              (this->info,left,(Type)0x1,curr,"unreachable try-catch must have unreachable try body"
               ,(this->
                super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                ).
                super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                .
                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                .currFunction);
    sVar2 = (curr->catchBodies).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (sVar2 != 0) {
      uVar13 = 0;
      do {
        if ((curr->catchBodies).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar13) goto LAB_009c7270;
        ValidationInfo::shouldBeEqual<wasm::Try*,wasm::Type>
                  (this->info,
                   (Type)((curr->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .data[uVar13]->type).id,(Type)0x1,curr,
                   "unreachable try-catch must have unreachable catch body",
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                   ).
                   super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                   .
                   super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                   .currFunction);
        uVar13 = uVar13 + 1;
      } while (sVar2 != uVar13);
    }
  }
  else {
    shouldBeSubType(this,left,right,curr->body,"try\'s type does not match try body\'s type");
    sVar2 = (curr->catchBodies).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (sVar2 != 0) {
      uVar13 = 0;
      do {
        if ((curr->catchBodies).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar13) goto LAB_009c7270;
        pEVar3 = (curr->catchBodies).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                 [uVar13];
        shouldBeSubType(this,(Type)(pEVar3->type).id,
                        (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)49>).
                              super_Expression.type.id,pEVar3,
                        "try\'s type does not match catch\'s body type");
        uVar13 = uVar13 + 1;
      } while (sVar2 != uVar13);
    }
  }
  ValidationInfo::shouldBeTrue<wasm::Try*>
            (this->info,
             (curr->catchBodies).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
             - (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
               usedElements < 2,curr,"the number of catch blocks and tags do not match",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  if ((curr->catchBodies).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
      .usedElements == 0) {
    bVar16 = false;
  }
  else {
    bVar16 = (curr->delegateTarget).super_IString.str._M_str != (char *)0x0;
  }
  ValidationInfo::shouldBeFalse<wasm::Try*>
            (this->info,bVar16,curr,"try cannot have both catch and delegate at the same time",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  if ((curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements == 0
     ) {
    pPVar9 = (Pop *)0x0;
  }
  else {
    uVar14 = 1;
    pPVar15 = (Pop *)0x0;
    pops.flexible.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)curr;
    do {
      curr_00 = (Try *)pops.flexible.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
      poVar8 = *(ostream **)
                &pops.flexible.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage[5][(long)pPVar15].
                 super_SpecificExpression<(wasm::Expression::Id)40>.super_Expression;
      pcVar12 = (char *)pops.flexible.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage[5][(long)pPVar15].
                        super_SpecificExpression<(wasm::Expression::Id)40>.super_Expression.type.id;
      name_05.super_IString.str._M_str = pcVar12;
      name_05.super_IString.str._M_len = (size_t)poVar8;
      pTVar4 = Module::getTagOrNull
                         ((this->
                          super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                          ).
                          super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          .
                          super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          .currModule,name_05);
      pcVar10 = "";
      bVar16 = ValidationInfo::shouldBeTrue<wasm::Try*>
                         (this->info,pTVar4 != (Tag *)0x0,curr_00,"",
                          (this->
                          super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                          ).
                          super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          .
                          super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          .currFunction);
      if (!bVar16) {
        poVar5 = ValidationInfo::getStream_abi_cxx11_
                           (this->info,
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                            ).
                            super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            .
                            super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            .currFunction);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,"tag name is invalid: ",0x15);
        curr_00 = (Try *)pops.flexible.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
        name.super_IString.str._M_str = pcVar10;
        name.super_IString.str._M_len = (size_t)pcVar12;
        poVar6 = wasm::operator<<((wasm *)poVar5,poVar8,name);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      }
      if ((Pop *)(curr_00->catchBodies).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements <= pPVar15) {
LAB_009c7270:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      pEVar3 = (curr_00->catchBodies).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
               [(long)pPVar15];
      EHUtils::findPops((SmallVector<wasm::Pop_*,_1UL> *)local_70,pEVar3);
      lVar7 = (long)pops.flexible.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)pops.fixed._M_elems[0] >> 3;
      func = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
      if ((pTVar4->sig).params.id == 0) {
        pcVar10 = "";
        bVar16 = ValidationInfo::shouldBeTrue<wasm::Try*>
                           (this->info,lVar7 + (long)local_70 == 0,curr_00,"",func);
        if (!bVar16) {
          poVar5 = ValidationInfo::getStream_abi_cxx11_
                             (this->info,
                              (this->
                              super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                              ).
                              super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                              .
                              super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                              .currFunction);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"catch\'s tag (",0xd)
          ;
          name_02.super_IString.str._M_str = pcVar10;
          name_02.super_IString.str._M_len = (size_t)pcVar12;
          poVar8 = wasm::operator<<((wasm *)poVar5,poVar8,name_02);
          lVar7 = 0x2d;
          pcVar12 = ") doesn\'t have any params, but there are pops";
          goto LAB_009c7184;
        }
      }
      else {
        pcVar10 = "";
        bVar16 = ValidationInfo::shouldBeTrue<wasm::Try*>
                           (this->info,lVar7 + (long)local_70 == 1,curr_00,"",func);
        if (bVar16) {
          ppPVar11 = pops.flexible.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          bVar16 = shouldBeSubType(this,(Type)(pTVar4->sig).params.id,
                                   (Type)*(uintptr_t *)(pops.usedFixed + 8),
                                   (Expression *)
                                   pops.flexible.
                                   super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,"");
          if (!bVar16) {
            poVar5 = ValidationInfo::getStream_abi_cxx11_
                               (this->info,
                                (this->
                                super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                ).
                                super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                .
                                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                .currFunction);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar5,"catch\'s tag (",0xd);
            name_00.super_IString.str._M_str = (char *)ppPVar11;
            name_00.super_IString.str._M_len = (size_t)pcVar12;
            poVar6 = wasm::operator<<((wasm *)poVar5,poVar8,name_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,")\'s pop doesn\'t have the same type as the tag\'s params",0x36);
          }
          bVar16 = EHUtils::containsValidDanglingPop(pEVar3);
          pcVar10 = "";
          bVar16 = ValidationInfo::shouldBeTrue<wasm::Try*>
                             (this->info,bVar16,
                              (Try *)pops.flexible.
                                     super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage,"",
                              (this->
                              super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                              ).
                              super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                              .
                              super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                              .currFunction);
          if (!bVar16) {
            poVar5 = ValidationInfo::getStream_abi_cxx11_
                               (this->info,
                                (this->
                                super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                ).
                                super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                .
                                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                .currFunction);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar5,"catch\'s body (",0xe);
            name_01.super_IString.str._M_str = pcVar10;
            name_01.super_IString.str._M_len = (size_t)pcVar12;
            poVar8 = wasm::operator<<((wasm *)poVar5,poVar8,name_01);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,")\'s pop\'s location is not valid",0x1f);
          }
        }
        else {
          poVar5 = ValidationInfo::getStream_abi_cxx11_
                             (this->info,
                              (this->
                              super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                              ).
                              super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                              .
                              super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                              .currFunction);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"catch\'s tag (",0xd)
          ;
          name_03.super_IString.str._M_str = pcVar10;
          name_03.super_IString.str._M_len = (size_t)pcVar12;
          poVar8 = wasm::operator<<((wasm *)poVar5,poVar8,name_03);
          lVar7 = 0x43;
          pcVar12 = ") has params, so there should be a single pop within the catch body";
LAB_009c7184:
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar12,lVar7);
        }
      }
      if (pops.fixed._M_elems[0] != (Pop *)0x0) {
        operator_delete((void *)pops.fixed._M_elems[0],
                        (long)pops.flexible.
                              super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pops.fixed._M_elems[0]);
      }
      pPVar15 = (Pop *)(ulong)uVar14;
      pPVar9 = pops.flexible.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[6];
      uVar14 = uVar14 + 1;
      curr = (Try *)pops.flexible.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
    } while (pPVar15 < pPVar9);
  }
  sVar2 = (curr->catchBodies).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  if (sVar2 - (long)pPVar9 == 1) {
    if (sVar2 == 0) {
      __assert_fail("usedElements > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                    ,0xd0,
                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                   );
    }
    EHUtils::findPops((SmallVector<wasm::Pop_*,_1UL> *)local_70,
                      (curr->catchBodies).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                      data[sVar2 - 1]);
    ValidationInfo::shouldBeTrue<wasm::Try*>
              (this->info,
               ((long)pops.flexible.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>.
                      _M_impl.super__Vector_impl_data._M_start - (long)pops.fixed._M_elems[0] >> 3)
               + (long)local_70 == 0,curr,"catch_all\'s body should not have pops",
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
    if (pops.fixed._M_elems[0] != (Pop *)0x0) {
      operator_delete((void *)pops.fixed._M_elems[0],
                      (long)pops.flexible.
                            super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pops.fixed._M_elems[0]);
    }
  }
  pcVar12 = (curr->delegateTarget).super_IString.str._M_str;
  if (pcVar12 != (char *)0x0) {
    name_06.super_IString.str._M_str = pcVar12;
    name_06.super_IString.str._M_len = (curr->delegateTarget).super_IString.str._M_len;
    noteDelegate(this,name_06,(Expression *)curr);
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_M_erase(&(this->rethrowTargetNames)._M_h,pNVar1);
  return;
}

Assistant:

void FunctionValidator::visitTry(Try* curr) {
  shouldBeTrue(getModule()->features.hasExceptionHandling(),
               curr,
               "try requires exception-handling [--enable-exception-handling]");
  if (curr->name.is()) {
    noteLabelName(curr->name);
  }
  if (curr->type != Type::unreachable) {
    shouldBeSubType(curr->body->type,
                    curr->type,
                    curr->body,
                    "try's type does not match try body's type");
    for (auto catchBody : curr->catchBodies) {
      shouldBeSubType(catchBody->type,
                      curr->type,
                      catchBody,
                      "try's type does not match catch's body type");
    }
  } else {
    shouldBeEqual(curr->body->type,
                  Type(Type::unreachable),
                  curr,
                  "unreachable try-catch must have unreachable try body");
    for (auto catchBody : curr->catchBodies) {
      shouldBeEqual(catchBody->type,
                    Type(Type::unreachable),
                    curr,
                    "unreachable try-catch must have unreachable catch body");
    }
  }
  shouldBeTrue(curr->catchBodies.size() - curr->catchTags.size() <= 1,
               curr,
               "the number of catch blocks and tags do not match");

  shouldBeFalse(curr->isCatch() && curr->isDelegate(),
                curr,
                "try cannot have both catch and delegate at the same time");

  for (Index i = 0; i < curr->catchTags.size(); i++) {
    Name tagName = curr->catchTags[i];
    auto* tag = getModule()->getTagOrNull(tagName);
    if (!shouldBeTrue(tag != nullptr, curr, "")) {
      getStream() << "tag name is invalid: " << tagName << "\n";
    }

    auto* catchBody = curr->catchBodies[i];
    auto pops = EHUtils::findPops(catchBody);
    if (tag->sig.params == Type::none) {
      if (!shouldBeTrue(pops.empty(), curr, "")) {
        getStream() << "catch's tag (" << tagName
                    << ") doesn't have any params, but there are pops";
      }
    } else {
      if (shouldBeTrue(pops.size() == 1, curr, "")) {
        auto* pop = *pops.begin();
        if (!shouldBeSubType(tag->sig.params, pop->type, curr, "")) {
          getStream()
            << "catch's tag (" << tagName
            << ")'s pop doesn't have the same type as the tag's params";
        }
        if (!shouldBeTrue(
              EHUtils::containsValidDanglingPop(catchBody), curr, "")) {
          getStream() << "catch's body (" << tagName
                      << ")'s pop's location is not valid";
        }
      } else {
        getStream() << "catch's tag (" << tagName
                    << ") has params, so there should be a single pop within "
                       "the catch body";
      }
    }
  }

  if (curr->hasCatchAll()) {
    auto* catchAllBody = curr->catchBodies.back();
    shouldBeTrue(EHUtils::findPops(catchAllBody).empty(),
                 curr,
                 "catch_all's body should not have pops");
  }

  if (curr->isDelegate()) {
    noteDelegate(curr->delegateTarget, curr);
  }

  rethrowTargetNames.erase(curr->name);
}